

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
::process_event<afsm::test::events::no_data>
          (states_tuple *states,size_t current_state,no_data *event)

{
  event_process_result eVar1;
  logic_error *this;
  invocation_table<afsm::test::events::no_data> *piVar2;
  reference this_00;
  indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> local_f1;
  undefined1 local_f0 [8];
  invocation_table<afsm::test::events::no_data> inv_table;
  no_data *event_local;
  size_t current_state_local;
  states_tuple *states_local;
  
  if (5 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  piVar2 = inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
           ::state_table<afsm::test::events::no_data,0ul,1ul,2ul,3ul,4ul,5ul>(&local_f1);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
  ::array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
           *)local_f0,piVar2);
  this_00 = std::
            array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
            ::operator[]((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
                          *)local_f0,current_state);
  eVar1 = std::
          function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>
          ::operator()(this_00,states,event);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
  ::~array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::no_data_&&)>,_6UL>
            *)local_f0);
  return eVar1;
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }